

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CryptoHelperLinux.cpp
# Opt level: O2

string * __thiscall
license::CryptoHelperLinux::exportPrivateKey_abi_cxx11_
          (string *__return_storage_ptr__,CryptoHelperLinux *this)

{
  BIO_METHOD *type;
  BIO *bp;
  long lVar1;
  char *data;
  logic_error *this_00;
  allocator local_10d;
  allocator local_10c;
  allocator local_10b;
  allocator local_10a;
  allocator local_109;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  string local_a8;
  string local_88;
  string local_68;
  string local_48;
  
  if (this->rsa != (RSA *)0x0) {
    type = BIO_s_mem();
    bp = BIO_new(type);
    PEM_write_bio_RSAPrivateKey
              (bp,(RSA *)this->rsa,(EVP_CIPHER *)0x0,(uchar *)0x0,0,(undefined1 *)0x0,(void *)0x0);
    lVar1 = BIO_ctrl(bp,10,0,(void *)0x0);
    data = (char *)calloc((long)((int)lVar1 + 1),1);
    BIO_read(bp,data,(int)lVar1);
    std::__cxx11::string::string((string *)&local_e8,"\"",&local_109);
    std::__cxx11::string::string((string *)&local_68,data,&local_10a);
    std::__cxx11::string::string((string *)&local_88,"\n",&local_10b);
    std::__cxx11::string::string((string *)&local_a8,"\\n\" \\\n\"",&local_10c);
    replaceAll(&local_48,&local_68,&local_88,&local_a8);
    std::operator+(&local_108,&local_e8,&local_48);
    std::__cxx11::string::string((string *)&local_c8,"\"",&local_10d);
    std::operator+(__return_storage_ptr__,&local_108,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_108);
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_e8);
    BIO_free_all(bp);
    free(data);
    return __return_storage_ptr__;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string
            ((string *)&local_108,"Export not initialized.Call generateKeyPair first.",
             (allocator *)&local_e8);
  std::logic_error::logic_error(this_00,(string *)&local_108);
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

const string CryptoHelperLinux::exportPrivateKey() const {
	if (rsa == NULL) {
		throw logic_error(
				string("Export not initialized.Call generateKeyPair first."));
	}
	BIO* bio_private = BIO_new(BIO_s_mem());
	PEM_write_bio_RSAPrivateKey(bio_private, rsa, NULL, NULL, 0, NULL, NULL);
	int keylen = BIO_pending(bio_private);
	char* pem_key = (char*) (calloc(keylen + 1, 1)); /* Null-terminate */
	BIO_read(bio_private, pem_key, keylen);
	string dest = string("\"")
			+ replaceAll(string(pem_key), string("\n"), string("\\n\" \\\n\""))
			+ string("\"");
	BIO_free_all(bio_private);
	free(pem_key);
	return dest;
}